

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O3

void vkt::anon_unknown_0::logRenderPassInfo(TestLog *log,RenderPass *renderPass)

{
  ostringstream *poVar1;
  pointer pAVar2;
  pointer pSVar3;
  pointer pSVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type *psVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ostringstream *poVar11;
  ScopedLogSection depthStencilAttachmentSection;
  ScopedLogSection inputAttachmentSection;
  ScopedLogSection inputAttachmentsSection;
  ScopedLogSection attachmentSection;
  ScopedLogSection attachmentsSection;
  ScopedLogSection section;
  string local_278;
  TestLog *local_250;
  string local_248;
  undefined1 local_228 [32];
  long *local_208 [2];
  long local_1f8 [2];
  ScopedLogSection local_1e8;
  ScopedLogSection local_1e0;
  RenderPass *local_1d8;
  ScopedLogSection local_1d0;
  ScopedLogSection local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_148 [8];
  ios_base local_140 [264];
  ScopedLogSection local_38;
  
  local_1b8._0_8_ = local_1b8 + 0x10;
  local_250 = log;
  local_1d8 = renderPass;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"RenderPass","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"RenderPass","");
  tcu::ScopedLogSection::ScopedLogSection(&local_38,local_250,(string *)local_1b8,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Attachments","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Attachments","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1c8,local_250,(string *)local_1b8,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((local_1d8->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_1d8->m_attachments).
      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    poVar11 = (ostringstream *)(local_1b8 + 8);
    lVar9 = 0x1c;
    uVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xada7cd);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar6) {
        local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar5[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)paVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac5568);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_248.field_2._M_allocated_capacity = *psVar7;
        local_248.field_2._8_8_ = plVar5[3];
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar7;
        local_248._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_248._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_1d0,local_250,&local_278,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      poVar1 = (ostringstream *)(local_1b8 + 8);
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      local_1c0 = uVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_,(ulong)((long)(deUint64 *)local_228._16_8_ + 1));
      }
      pAVar2 = (local_1d8->m_attachments).
               super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1b8._0_8_ = local_250;
      std::__cxx11::ostringstream::ostringstream(poVar11);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Format: ",8);
      local_278._M_dataplus._M_p = (pointer)::vk::getFormatName;
      local_278._M_string_length._0_4_ = *(undefined4 *)((long)pAVar2 + lVar9 + -0x1c);
      tcu::Format::Enum<vk::VkFormat,_4UL>::toStream
                ((Enum<vk::VkFormat,_4UL> *)&local_278,(ostream *)poVar11);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar11);
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Samples: ",9);
      std::ostream::operator<<(poVar1,*(int *)((long)pAVar2 + lVar9 + -0x18));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"LoadOp: ",8);
      local_278._M_string_length._0_4_ = *(undefined4 *)((long)pAVar2 + lVar9 + -0x14);
      local_278._M_dataplus._M_p = (pointer)::vk::getAttachmentLoadOpName;
      tcu::Format::Enum<vk::VkAttachmentLoadOp,_4UL>::toStream
                ((Enum<vk::VkAttachmentLoadOp,_4UL> *)&local_278,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"StoreOp: ",9);
      local_278._M_string_length._0_4_ = *(undefined4 *)((long)pAVar2 + lVar9 + -0x10);
      local_278._M_dataplus._M_p = (pointer)::vk::getAttachmentStoreOpName;
      tcu::Format::Enum<vk::VkAttachmentStoreOp,_4UL>::toStream
                ((Enum<vk::VkAttachmentStoreOp,_4UL> *)&local_278,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"StencilLoadOp: ",0xf);
      local_278._M_string_length._0_4_ = *(undefined4 *)((long)pAVar2 + lVar9 + -0xc);
      local_278._M_dataplus._M_p = (pointer)::vk::getAttachmentLoadOpName;
      tcu::Format::Enum<vk::VkAttachmentLoadOp,_4UL>::toStream
                ((Enum<vk::VkAttachmentLoadOp,_4UL> *)&local_278,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"StencilStoreOp: ",0x10);
      local_278._M_string_length._0_4_ = *(undefined4 *)((long)pAVar2 + lVar9 + -8);
      local_278._M_dataplus._M_p = (pointer)::vk::getAttachmentStoreOpName;
      tcu::Format::Enum<vk::VkAttachmentStoreOp,_4UL>::toStream
                ((Enum<vk::VkAttachmentStoreOp,_4UL> *)&local_278,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"InitialLayout: ",0xf);
      local_278._M_string_length._0_4_ = *(undefined4 *)((long)pAVar2 + lVar9 + -4);
      local_278._M_dataplus._M_p = (pointer)::vk::getImageLayoutName;
      tcu::Format::Enum<vk::VkImageLayout,_4UL>::toStream
                ((Enum<vk::VkImageLayout,_4UL> *)&local_278,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      local_1b8._0_8_ = local_250;
      poVar1 = (ostringstream *)(local_1b8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"FinalLayout: ",0xd);
      local_278._M_dataplus._M_p = (pointer)::vk::getImageLayoutName;
      local_278._M_string_length =
           CONCAT44(local_278._M_string_length._4_4_,
                    *(undefined4 *)((long)&pAVar2->m_format + lVar9));
      tcu::Format::Enum<vk::VkImageLayout,_4UL>::toStream
                ((Enum<vk::VkImageLayout,_4UL> *)&local_278,(ostream *)poVar1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_140);
      tcu::TestLog::endSection(local_1d0.m_log);
      uVar8 = local_1c0 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar8 < (ulong)((long)(local_1d8->m_attachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_1d8->m_attachments).
                                   super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  tcu::TestLog::endSection(local_1c8.m_log);
  local_1b8._0_8_ = local_1b8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Subpasses","");
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Subpasses","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1c8,local_250,(string *)local_1b8,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
  }
  if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if ((local_1d8->m_subpasses).
      super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_1d8->m_subpasses).
      super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb75dc4);
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 == paVar6) {
        local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_278.field_2._8_8_ = plVar5[3];
      }
      else {
        local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
        local_278._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_278._M_string_length = plVar5[1];
      *plVar5 = (long)paVar6;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac55e5);
      psVar7 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_248.field_2._M_allocated_capacity = *psVar7;
        local_248.field_2._8_8_ = plVar5[3];
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar7;
        local_248._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_248._M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      tcu::ScopedLogSection::ScopedLogSection(&local_1d0,local_250,&local_278,&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_208[0] != local_1f8) {
        operator_delete(local_208[0],local_1f8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_,(ulong)((long)(deUint64 *)local_228._16_8_ + 1));
      }
      pSVar3 = (local_1d8->m_subpasses).
               super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c0 = uVar8;
      if (*(pointer *)
           &pSVar3[uVar8].m_inputAttachments.
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl !=
          *(pointer *)
           ((long)&pSVar3[uVar8].m_inputAttachments.
                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ._M_impl + 8)) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Inputs","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Inputs","");
        tcu::ScopedLogSection::ScopedLogSection(&local_1e0,local_250,(string *)local_1b8,&local_278)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (*(pointer *)
             ((long)&pSVar3[uVar8].m_inputAttachments.
                     super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                     ._M_impl + 8) !=
            pSVar3[uVar8].m_inputAttachments.
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar10 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xac5412);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar6) {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278.field_2._8_8_ = plVar5[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_278._M_string_length = plVar5[1];
            *plVar5 = (long)paVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac5651);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248.field_2._8_8_ = plVar5[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248._M_dataplus._M_p = (pointer)*plVar5;
            }
            poVar11 = (ostringstream *)(local_1b8 + 8);
            local_248._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            tcu::ScopedLogSection::ScopedLogSection(&local_1e8,local_250,&local_278,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,
                              (ulong)((long)(deUint64 *)local_228._16_8_ + 1));
            }
            lVar9 = *(long *)&pSVar3[uVar8].m_inputAttachments.
                              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                              ._M_impl.super__Vector_impl_data;
            local_1b8._0_8_ = local_250;
            poVar1 = (ostringstream *)(local_1b8 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Attachment: ",0xc)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
            std::ios_base::~ios_base(local_140);
            local_1b8._0_8_ = local_250;
            std::__cxx11::ostringstream::ostringstream(poVar11);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Layout: ",8);
            local_278._M_dataplus._M_p = (pointer)::vk::getImageLayoutName;
            local_278._M_string_length =
                 CONCAT44(local_278._M_string_length._4_4_,*(undefined4 *)(lVar9 + 4 + uVar10 * 8));
            tcu::Format::Enum<vk::VkImageLayout,_4UL>::toStream
                      ((Enum<vk::VkImageLayout,_4UL> *)&local_278,(ostream *)poVar11);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar11);
            std::ios_base::~ios_base(local_140);
            tcu::TestLog::endSection(local_1e8.m_log);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)*(pointer *)
                                           ((long)&pSVar3[uVar8].m_inputAttachments.
                                                                                                      
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl + 8) -
                                    *(long *)&pSVar3[uVar8].m_inputAttachments.
                                              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                              ._M_impl.super__Vector_impl_data >> 3));
        }
        tcu::TestLog::endSection(local_1e0.m_log);
      }
      if (pSVar3[uVar8].m_depthStencilAttachment.m_attachment != 0xffffffff) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"DepthStencil","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"DepthStencil","");
        tcu::ScopedLogSection::ScopedLogSection
                  ((ScopedLogSection *)local_228,local_250,(string *)local_1b8,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        local_1b8._0_8_ = local_250;
        poVar11 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Attachment: ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        poVar11 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Layout: ",8);
        local_278._M_dataplus._M_p = (pointer)::vk::getImageLayoutName;
        local_278._M_string_length =
             CONCAT44(local_278._M_string_length._4_4_,
                      pSVar3[uVar8].m_depthStencilAttachment.m_layout);
        tcu::Format::Enum<vk::VkImageLayout,_4UL>::toStream
                  ((Enum<vk::VkImageLayout,_4UL> *)&local_278,(ostream *)poVar11);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base(local_140);
        tcu::TestLog::endSection((TestLog *)local_228._0_8_);
      }
      poVar11 = (ostringstream *)(local_1b8 + 8);
      if (pSVar3[uVar8].m_colorAttachments.
          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&pSVar3[uVar8].m_colorAttachments.
                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ._M_impl + 8)) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Colors","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Colors","");
        tcu::ScopedLogSection::ScopedLogSection(&local_1e0,local_250,(string *)local_1b8,&local_278)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (*(pointer *)
             ((long)&pSVar3[uVar8].m_colorAttachments.
                     super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                     ._M_impl + 8) !=
            pSVar3[uVar8].m_colorAttachments.
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar10 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xac6fad);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar6) {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278.field_2._8_8_ = plVar5[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_278._M_string_length = plVar5[1];
            *plVar5 = (long)paVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac5679);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248.field_2._8_8_ = plVar5[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_248._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            tcu::ScopedLogSection::ScopedLogSection(&local_1e8,local_250,&local_278,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,
                              (ulong)((long)(deUint64 *)local_228._16_8_ + 1));
            }
            lVar9 = *(long *)&pSVar3[uVar8].m_colorAttachments.
                              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                              ._M_impl.super__Vector_impl_data;
            local_1b8._0_8_ = local_250;
            std::__cxx11::ostringstream::ostringstream(poVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar11,"Attachment: ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar11);
            std::ios_base::~ios_base(local_140);
            local_1b8._0_8_ = local_250;
            poVar1 = (ostringstream *)(local_1b8 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Layout: ",8);
            local_278._M_dataplus._M_p = (pointer)::vk::getImageLayoutName;
            local_278._M_string_length =
                 CONCAT44(local_278._M_string_length._4_4_,*(undefined4 *)(lVar9 + 4 + uVar10 * 8));
            tcu::Format::Enum<vk::VkImageLayout,_4UL>::toStream
                      ((Enum<vk::VkImageLayout,_4UL> *)&local_278,(ostream *)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
            std::ios_base::~ios_base(local_140);
            tcu::TestLog::endSection(local_1e8.m_log);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)*(pointer *)
                                           ((long)&pSVar3[uVar8].m_colorAttachments.
                                                                                                      
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl + 8) -
                                    *(long *)&pSVar3[uVar8].m_colorAttachments.
                                              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                              ._M_impl.super__Vector_impl_data >> 3));
        }
        tcu::TestLog::endSection(local_1e0.m_log);
      }
      poVar11 = (ostringstream *)(local_1b8 + 8);
      if (pSVar3[uVar8].m_resolveAttachments.
          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&pSVar3[uVar8].m_resolveAttachments.
                   super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                   ._M_impl + 8)) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Resolves","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Resolves","");
        tcu::ScopedLogSection::ScopedLogSection(&local_1e0,local_250,(string *)local_1b8,&local_278)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (*(pointer *)
             ((long)&pSVar3[uVar8].m_resolveAttachments.
                     super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                     ._M_impl + 8) !=
            pSVar3[uVar8].m_resolveAttachments.
            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          uVar10 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xac5689);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar6) {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278.field_2._8_8_ = plVar5[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_278._M_string_length = plVar5[1];
            *plVar5 = (long)paVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac5691);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248.field_2._8_8_ = plVar5[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_248._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            tcu::ScopedLogSection::ScopedLogSection(&local_1e8,local_250,&local_278,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,
                              (ulong)((long)(deUint64 *)local_228._16_8_ + 1));
            }
            lVar9 = *(long *)&pSVar3[uVar8].m_resolveAttachments.
                              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                              ._M_impl.super__Vector_impl_data;
            local_1b8._0_8_ = local_250;
            std::__cxx11::ostringstream::ostringstream(poVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar11,"Attachment: ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar11);
            std::ios_base::~ios_base(local_140);
            local_1b8._0_8_ = local_250;
            poVar1 = (ostringstream *)(local_1b8 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Layout: ",8);
            local_278._M_dataplus._M_p = (pointer)::vk::getImageLayoutName;
            local_278._M_string_length =
                 CONCAT44(local_278._M_string_length._4_4_,*(undefined4 *)(lVar9 + 4 + uVar10 * 8));
            tcu::Format::Enum<vk::VkImageLayout,_4UL>::toStream
                      ((Enum<vk::VkImageLayout,_4UL> *)&local_278,(ostream *)poVar1);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
            std::ios_base::~ios_base(local_140);
            tcu::TestLog::endSection(local_1e8.m_log);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)*(pointer *)
                                           ((long)&pSVar3[uVar8].m_resolveAttachments.
                                                                                                      
                                                  super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                                  ._M_impl + 8) -
                                    *(long *)&pSVar3[uVar8].m_resolveAttachments.
                                              super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                              ._M_impl.super__Vector_impl_data >> 3));
        }
        tcu::TestLog::endSection(local_1e0.m_log);
      }
      poVar11 = (ostringstream *)(local_1b8 + 8);
      if (pSVar3[uVar8].m_preserveAttachments.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&pSVar3[uVar8].m_preserveAttachments.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)) {
        local_1b8._0_8_ = local_1b8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Preserves","");
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Preserves","");
        tcu::ScopedLogSection::ScopedLogSection(&local_1e0,local_250,(string *)local_1b8,&local_278)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
          operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
        }
        if (*(pointer *)
             ((long)&pSVar3[uVar8].m_preserveAttachments.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8) !=
            pSVar3[uVar8].m_preserveAttachments.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar10 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xac56a4);
            local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 == paVar6) {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278.field_2._8_8_ = plVar5[3];
            }
            else {
              local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
              local_278._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_278._M_string_length = plVar5[1];
            *plVar5 = (long)paVar6;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base(local_148);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac56ad);
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            psVar7 = (size_type *)(plVar5 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar5 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar7) {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248.field_2._8_8_ = plVar5[3];
            }
            else {
              local_248.field_2._M_allocated_capacity = *psVar7;
              local_248._M_dataplus._M_p = (pointer)*plVar5;
            }
            local_248._M_string_length = plVar5[1];
            *plVar5 = (long)psVar7;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            tcu::ScopedLogSection::ScopedLogSection(&local_1e8,local_250,&local_278,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_208[0] != local_1f8) {
              operator_delete(local_208[0],local_1f8[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_278._M_dataplus._M_p != &local_278.field_2) {
              operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_228 + 0x10)) {
              operator_delete((void *)local_228._0_8_,
                              (ulong)((long)(deUint64 *)local_228._16_8_ + 1));
            }
            local_1b8._0_8_ = local_250;
            std::__cxx11::ostringstream::ostringstream(poVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar11,"Attachment: ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar11);
            std::ios_base::~ios_base(local_140);
            tcu::TestLog::endSection(local_1e8.m_log);
            uVar10 = uVar10 + 1;
          } while (uVar10 < (ulong)((long)*(pointer *)
                                           ((long)&pSVar3[uVar8].m_preserveAttachments.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl + 8) -
                                    *(long *)&pSVar3[uVar8].m_preserveAttachments.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data >> 2));
        }
        tcu::TestLog::endSection(local_1e0.m_log);
      }
      tcu::TestLog::endSection(local_1d0.m_log);
      uVar8 = local_1c0 + 1;
    } while (uVar8 < (ulong)(((long)(local_1d8->m_subpasses).
                                    super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_1d8->m_subpasses).
                                    super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            0x6db6db6db6db6db7));
  }
  tcu::TestLog::endSection(local_1c8.m_log);
  if ((local_1d8->m_dependencies).
      super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (local_1d8->m_dependencies).
      super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1b8._0_8_ = local_1b8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"Dependencies","");
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Dependencies","");
    tcu::ScopedLogSection::ScopedLogSection(&local_1c8,local_250,(string *)local_1b8,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((TestLog *)local_1b8._0_8_ != (TestLog *)(local_1b8 + 0x10)) {
      operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
    }
    if ((local_1d8->m_dependencies).
        super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_1d8->m_dependencies).
        super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      poVar11 = (ostringstream *)(local_1b8 + 8);
      lVar9 = 0x18;
      uVar8 = 0;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
        std::ios_base::~ios_base(local_148);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xac56c4);
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 == paVar6) {
          local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_278.field_2._8_8_ = plVar5[3];
        }
        else {
          local_278.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_278._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_278._M_string_length = plVar5[1];
        *plVar5 = (long)paVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
        std::ios_base::~ios_base(local_148);
        plVar5 = (long *)std::__cxx11::string::replace((ulong)local_208,0,(char *)0x0,0xac56cf);
        psVar7 = (size_type *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar5 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_248.field_2._M_allocated_capacity = *psVar7;
          local_248.field_2._8_8_ = plVar5[3];
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        }
        else {
          local_248.field_2._M_allocated_capacity = *psVar7;
          local_248._M_dataplus._M_p = (pointer)*plVar5;
        }
        local_248._M_string_length = plVar5[1];
        *plVar5 = (long)psVar7;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        tcu::ScopedLogSection::ScopedLogSection(&local_1d0,local_250,&local_278,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        poVar1 = (ostringstream *)(local_1b8 + 8);
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        local_1c0 = uVar8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_228 + 0x10)) {
          operator_delete((void *)local_228._0_8_,(ulong)((long)(deUint64 *)local_228._16_8_ + 1));
        }
        pSVar4 = (local_1d8->m_dependencies).
                 super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_1b8._0_8_ = local_250;
        std::__cxx11::ostringstream::ostringstream(poVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar11,"Source: ",8);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar11);
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Destination: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Source Stage Mask: ",0x13);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Destination Stage Mask: ",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Input Mask: ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Output Mask: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        local_1b8._0_8_ = local_250;
        poVar1 = (ostringstream *)(local_1b8 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Dependency Flags: ",0x12);
        ::vk::getDependencyFlagsStr
                  ((Bitfield<32UL> *)local_228,
                   *(VkDependencyFlags *)((long)&pSVar4->m_srcPass + lVar9));
        local_278.field_2._M_allocated_capacity = local_228._16_8_;
        local_278._M_dataplus._M_p = (pointer)local_228._0_8_;
        local_278._M_string_length = local_228._8_8_;
        tcu::Format::Bitfield<32UL>::toStream((Bitfield<32UL> *)&local_278,(ostream *)poVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        tcu::TestLog::endSection(local_1d0.m_log);
        uVar8 = local_1c0 + 1;
        lVar9 = lVar9 + 0x1c;
      } while (uVar8 < (ulong)(((long)(local_1d8->m_dependencies).
                                      super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_1d8->m_dependencies).
                                      super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2) *
                              0x6db6db6db6db6db7));
    }
    tcu::TestLog::endSection(local_1c8.m_log);
  }
  tcu::TestLog::endSection(local_38.m_log);
  return;
}

Assistant:

void logRenderPassInfo (TestLog&			log,
						const RenderPass&	renderPass)
{
	const tcu::ScopedLogSection section (log, "RenderPass", "RenderPass");

	{
		const tcu::ScopedLogSection	attachmentsSection	(log, "Attachments", "Attachments");
		const vector<Attachment>&	attachments			= renderPass.getAttachments();

		for (size_t attachmentNdx = 0; attachmentNdx < attachments.size(); attachmentNdx++)
		{
			const tcu::ScopedLogSection	attachmentSection	(log, "Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx));
			const Attachment&			attachment			= attachments[attachmentNdx];

			log << TestLog::Message << "Format: " << attachment.getFormat() << TestLog::EndMessage;
			log << TestLog::Message << "Samples: " << attachment.getSamples() << TestLog::EndMessage;

			log << TestLog::Message << "LoadOp: " << attachment.getLoadOp() << TestLog::EndMessage;
			log << TestLog::Message << "StoreOp: " << attachment.getStoreOp() << TestLog::EndMessage;

			log << TestLog::Message << "StencilLoadOp: " << attachment.getStencilLoadOp() << TestLog::EndMessage;
			log << TestLog::Message << "StencilStoreOp: " << attachment.getStencilStoreOp() << TestLog::EndMessage;

			log << TestLog::Message << "InitialLayout: " << attachment.getInitialLayout() << TestLog::EndMessage;
			log << TestLog::Message << "FinalLayout: " << attachment.getFinalLayout() << TestLog::EndMessage;
		}
	}

	{
		const tcu::ScopedLogSection	subpassesSection	(log, "Subpasses", "Subpasses");
		const vector<Subpass>&		subpasses			= renderPass.getSubpasses();

		for (size_t subpassNdx = 0; subpassNdx < subpasses.size(); subpassNdx++)
		{
			const tcu::ScopedLogSection			subpassSection		(log, "Subpass" + de::toString(subpassNdx), "Subpass " + de::toString(subpassNdx));
			const Subpass&						subpass				= subpasses[subpassNdx];

			const vector<AttachmentReference>&	inputAttachments	= subpass.getInputAttachments();
			const vector<AttachmentReference>&	colorAttachments	= subpass.getColorAttachments();
			const vector<AttachmentReference>&	resolveAttachments	= subpass.getResolveAttachments();
			const vector<deUint32>&				preserveAttachments	= subpass.getPreserveAttachments();

			if (!inputAttachments.empty())
			{
				const tcu::ScopedLogSection	inputAttachmentsSection	(log, "Inputs", "Inputs");

				for (size_t inputNdx = 0; inputNdx < inputAttachments.size(); inputNdx++)
				{
					const tcu::ScopedLogSection	inputAttachmentSection	(log, "Input" + de::toString(inputNdx), "Input " + de::toString(inputNdx));
					const AttachmentReference&	inputAttachment			= inputAttachments[inputNdx];

					log << TestLog::Message << "Attachment: " << inputAttachment.getAttachment() << TestLog::EndMessage;
					log << TestLog::Message << "Layout: " << inputAttachment.getImageLayout() << TestLog::EndMessage;
				}
			}

			if (subpass.getDepthStencilAttachment().getAttachment() != VK_ATTACHMENT_UNUSED)
			{
				const tcu::ScopedLogSection	depthStencilAttachmentSection	(log, "DepthStencil", "DepthStencil");
				const AttachmentReference&	depthStencilAttachment			= subpass.getDepthStencilAttachment();

				log << TestLog::Message << "Attachment: " << depthStencilAttachment.getAttachment() << TestLog::EndMessage;
				log << TestLog::Message << "Layout: " << depthStencilAttachment.getImageLayout() << TestLog::EndMessage;
			}

			if (!colorAttachments.empty())
			{
				const tcu::ScopedLogSection	colorAttachmentsSection	(log, "Colors", "Colors");

				for (size_t colorNdx = 0; colorNdx < colorAttachments.size(); colorNdx++)
				{
					const tcu::ScopedLogSection	colorAttachmentSection	(log, "Color" + de::toString(colorNdx), "Color " + de::toString(colorNdx));
					const AttachmentReference&	colorAttachment			= colorAttachments[colorNdx];

					log << TestLog::Message << "Attachment: " << colorAttachment.getAttachment() << TestLog::EndMessage;
					log << TestLog::Message << "Layout: " << colorAttachment.getImageLayout() << TestLog::EndMessage;
				}
			}

			if (!resolveAttachments.empty())
			{
				const tcu::ScopedLogSection	resolveAttachmentsSection	(log, "Resolves", "Resolves");

				for (size_t resolveNdx = 0; resolveNdx < resolveAttachments.size(); resolveNdx++)
				{
					const tcu::ScopedLogSection	resolveAttachmentSection	(log, "Resolve" + de::toString(resolveNdx), "Resolve " + de::toString(resolveNdx));
					const AttachmentReference&	resolveAttachment			= resolveAttachments[resolveNdx];

					log << TestLog::Message << "Attachment: " << resolveAttachment.getAttachment() << TestLog::EndMessage;
					log << TestLog::Message << "Layout: " << resolveAttachment.getImageLayout() << TestLog::EndMessage;
				}
			}

			if (!preserveAttachments.empty())
			{
				const tcu::ScopedLogSection	preserveAttachmentsSection	(log, "Preserves", "Preserves");

				for (size_t preserveNdx = 0; preserveNdx < preserveAttachments.size(); preserveNdx++)
				{
					const tcu::ScopedLogSection	preserveAttachmentSection	(log, "Preserve" + de::toString(preserveNdx), "Preserve " + de::toString(preserveNdx));
					const deUint32				preserveAttachment			= preserveAttachments[preserveNdx];

					log << TestLog::Message << "Attachment: " << preserveAttachment << TestLog::EndMessage;
				}
			}
		}

	}

	if (!renderPass.getDependencies().empty())
	{
		const tcu::ScopedLogSection	dependenciesSection	(log, "Dependencies", "Dependencies");

		for (size_t depNdx = 0; depNdx < renderPass.getDependencies().size(); depNdx++)
		{
			const tcu::ScopedLogSection	dependencySection	(log, "Dependency" + de::toString(depNdx), "Dependency " + de::toString(depNdx));
			const SubpassDependency&	dep					= renderPass.getDependencies()[depNdx];

			log << TestLog::Message << "Source: " << dep.getSrcPass() << TestLog::EndMessage;
			log << TestLog::Message << "Destination: " << dep.getDstPass() << TestLog::EndMessage;

			log << TestLog::Message << "Source Stage Mask: " << dep.getSrcStageMask() << TestLog::EndMessage;
			log << TestLog::Message << "Destination Stage Mask: " << dep.getDstStageMask() << TestLog::EndMessage;

			log << TestLog::Message << "Input Mask: " << dep.getInputMask() << TestLog::EndMessage;
			log << TestLog::Message << "Output Mask: " << dep.getOutputMask() << TestLog::EndMessage;
			log << TestLog::Message << "Dependency Flags: " << getDependencyFlagsStr(dep.getFlags()) << TestLog::EndMessage;
		}
	}
}